

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O0

void lyb_insert_node(lyd_lyb_ctx *lybctx,lyd_node *parent,lyd_node *node,lyd_node **first_p,
                    ly_set *parsed)

{
  bool bVar1;
  ly_ctx *local_48;
  ly_ctx *local_38;
  ly_set *parsed_local;
  lyd_node **first_p_local;
  lyd_node *node_local;
  lyd_node *parent_local;
  lyd_lyb_ctx *lybctx_local;
  
  if (parent != (lyd_node *)0x0) {
    if (parent->schema == (lysc_node *)0x0) {
      local_38 = (ly_ctx *)parent[2].schema;
    }
    else {
      local_38 = parent->schema->module->ctx;
    }
    if (node->schema == (lysc_node *)0x0) {
      local_48 = (ly_ctx *)node[2].schema;
    }
    else {
      local_48 = node->schema->module->ctx;
    }
    if (local_38 != local_48) {
      lyplg_ext_insert(parent,node);
      goto LAB_00155bff;
    }
  }
  lyd_insert_node(parent,first_p,node,(uint)(((lybctx->field_1).field_0.parse_opts & 0x200000) != 0)
                 );
LAB_00155bff:
  while( true ) {
    bVar1 = false;
    if (parent == (lyd_node *)0x0) {
      bVar1 = (*first_p)->prev->next != (lyd_node *)0x0;
    }
    if (!bVar1) break;
    *first_p = (*first_p)->prev;
  }
  if (parsed != (ly_set *)0x0) {
    ly_set_add(parsed,node,'\x01',(uint32_t *)0x0);
  }
  return;
}

Assistant:

static void
lyb_insert_node(struct lyd_lyb_ctx *lybctx, struct lyd_node *parent, struct lyd_node *node, struct lyd_node **first_p,
        struct ly_set *parsed)
{
    /* insert, keep first pointer correct */
    if (parent && (LYD_CTX(parent) != LYD_CTX(node))) {
        lyplg_ext_insert(parent, node);
    } else {
        lyd_insert_node(parent, first_p, node,
                lybctx->parse_opts & LYD_PARSE_ORDERED ? LYD_INSERT_NODE_LAST : LYD_INSERT_NODE_DEFAULT);
    }
    while (!parent && (*first_p)->prev->next) {
        *first_p = (*first_p)->prev;
    }

    /* rememeber a successfully parsed node */
    if (parsed) {
        ly_set_add(parsed, node, 1, NULL);
    }
}